

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

id gpt_sample_top_k_top_p_repeat
             (gpt_vocab *vocab,float *logits,int32_t *last_n_tokens_data,
             size_t last_n_tokens_data_size,int top_k,double top_p,double temp,int repeat_last_n,
             float repeat_penalty,mt19937 *rng)

{
  undefined8 uVar1;
  size_t sVar2;
  double *pdVar3;
  uint uVar4;
  float fVar5;
  id iVar6;
  result_type_conflict rVar7;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  int iVar9;
  uint uVar10;
  pointer ppVar11;
  id iVar12;
  pair<double,_int> *kv_1;
  long lVar13;
  long lVar14;
  pointer ppVar15;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  __i;
  pair<double,_int> *ppVar16;
  ulong uVar17;
  int *piVar18;
  size_type sVar19;
  bool bVar20;
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> logits_id;
  vector<double,_std::allocator<double>_> probs;
  discrete_distribution<int> dist;
  vector<int,_std::allocator<int>_> last_n_tokens;
  double local_d0;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  uint local_8c;
  double local_88;
  param_type local_80;
  void *local_50;
  int *local_48;
  long local_40;
  double local_38;
  
  local_88 = (double)CONCAT44(local_88._4_4_,repeat_penalty);
  sVar2 = (vocab->id_to_token)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_38 = top_p;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_50,last_n_tokens_data,
             last_n_tokens_data + last_n_tokens_data_size,(allocator_type *)&local_80);
  uVar10 = (uint)sVar2;
  if (temp <= 0.0) {
    iVar12 = 0;
    if (1 < (int)uVar10) {
      fVar21 = *logits;
      iVar12 = 0;
      uVar17 = 1;
      do {
        fVar5 = logits[uVar17];
        iVar6 = (id)uVar17;
        if (logits[uVar17] <= fVar21) {
          fVar5 = fVar21;
          iVar6 = iVar12;
        }
        iVar12 = iVar6;
        fVar21 = fVar5;
        uVar17 = uVar17 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar17);
    }
  }
  else {
    local_c8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pair<double,_int> *)0x0;
    local_c8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<double,_int> *)0x0;
    local_c8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_int> *)0x0;
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
              (&local_c8,(long)(int)uVar10);
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_8c = top_k;
    if (0 < (int)uVar10) {
      iVar9 = 0;
      do {
        if (repeat_last_n < 1) {
LAB_0010f397:
          local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = iVar9;
          local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(double)(logits[(int)local_80._M_prob.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish] *
                                (float)(1.0 / temp));
          if (local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>
                      ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                       &local_c8,
                       (iterator)
                       local_c8.
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(pair<double,_int> *)&local_80);
          }
          else {
LAB_0010f3ef:
            (local_c8.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->first =
                 (double)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
            *(ulong *)&(local_c8.
                        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->second =
                 CONCAT44(local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
            local_c8.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_c8.
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            (local_48 + -(ulong)(uint)repeat_last_n,local_48,&local_a8);
          iVar9 = (int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          if (_Var8._M_current == local_48) goto LAB_0010f397;
          fVar21 = logits[(int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start] * (float)(1.0 / temp);
          if (0.0 <= logits[(int)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start]) {
            local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(double)(fVar21 / local_88._0_4_);
            local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ =
                 (int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>
                        ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                         &local_c8,
                         (iterator)
                         local_c8.
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(pair<double,_int> *)&local_80);
              goto LAB_0010f3fd;
            }
            goto LAB_0010f3ef;
          }
          local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(double)(fVar21 * local_88._0_4_);
          local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               (int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010f3ef;
          std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
          _M_realloc_insert<std::pair<double,int>>
                    ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                     &local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(pair<double,_int> *)&local_80);
        }
LAB_0010f3fd:
        iVar9 = (int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CONCAT44(local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,iVar9);
      } while (iVar9 < (int)uVar10);
    }
    ppVar15 = local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppVar11 = local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar19 = (size_type)(int)local_8c;
    lVar13 = sVar19 * 0x10;
    ppVar16 = local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start + sVar19;
    uVar10 = local_8c;
    if (1 < (int)local_8c) {
      uVar17 = sVar19 - 2 >> 1;
      piVar18 = &local_c8.
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].second;
      do {
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                  (SUB84(((pair<double,_int> *)(piVar18 + -2))->first,0),ppVar11,uVar17,sVar19,
                   *piVar18);
        piVar18 = piVar18 + -4;
        bVar20 = uVar17 != 0;
        uVar17 = uVar17 - 1;
        uVar10 = local_8c;
      } while (bVar20);
    }
    for (; uVar4 = local_8c, ppVar16 < ppVar15; ppVar16 = ppVar16 + 1) {
      local_8c = uVar10;
      if (ppVar11->first < ppVar16->first) {
        iVar9 = ppVar16->second;
        ppVar16->first = ppVar11->first;
        ppVar16->second = ppVar11->second;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                  (ppVar11,0,sVar19,iVar9);
      }
      uVar10 = local_8c;
      local_8c = uVar4;
    }
    bVar20 = 1 < (int)local_8c;
    local_8c = uVar10;
    if (bVar20) {
      do {
        lVar14 = lVar13 + -0x10;
        uVar1 = *(undefined8 *)((long)&ppVar11[-1].first + lVar13);
        uVar22 = *(undefined4 *)((long)&ppVar11[-1].second + lVar13);
        *(double *)((long)&ppVar11[-1].first + lVar13) = ppVar11->first;
        *(int *)((long)&ppVar11[-1].second + lVar13) = ppVar11->second;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                  ((int)uVar1,ppVar11,0,lVar14 >> 4,uVar22);
        lVar13 = lVar14;
      } while (0x10 < lVar14);
    }
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&local_c8,sVar19);
    if (local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      local_88 = -INFINITY;
    }
    else {
      uVar22 = 0;
      uVar23 = 0xfff00000;
      ppVar11 = local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_88 = ppVar11->first;
        if (local_88 <= (double)CONCAT44(uVar23,uVar22)) {
          local_88 = (double)CONCAT44(uVar23,uVar22);
        }
        ppVar11 = ppVar11 + 1;
        uVar22 = SUB84(local_88,0);
        uVar23 = (undefined4)((ulong)local_88 >> 0x20);
      } while (ppVar11 !=
               local_c8.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    std::vector<double,_std::allocator<double>_>::reserve
              (&local_a8,
               (long)local_c8.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    ppVar11 = local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      local_d0 = 0.0;
      pdVar3 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      local_d0 = 0.0;
      ppVar15 = local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)exp(ppVar15->first - local_88);
        if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_80);
        }
        else {
          *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_d0 = local_d0 +
                   (double)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
        ppVar15 = ppVar15 + 1;
        pdVar3 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (ppVar15 != ppVar11);
    }
    for (; pdVar3 != local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
      *pdVar3 = *pdVar3 / local_d0;
    }
    if (local_38 < 1.0) {
      if ((int)uVar4 < 1) {
        local_d0 = 0.0;
      }
      else {
        local_d0 = 0.0;
        sVar19 = 1;
        do {
          local_d0 = local_d0 +
                     local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar19 - 1];
          if (local_38 <= local_d0) {
            std::vector<double,_std::allocator<double>_>::resize(&local_a8,sVar19);
            std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                      (&local_c8,sVar19);
            break;
          }
          bVar20 = sVar19 != uVar4;
          sVar19 = sVar19 + 1;
        } while (bVar20);
      }
      uVar10 = (uint)((ulong)((long)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (0 < (int)uVar10) {
        uVar17 = 0;
        do {
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar17] =
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17] * (1.0 / local_d0);
          uVar17 = uVar17 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar17);
      }
    }
    std::discrete_distribution<int>::param_type::
    param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (&local_80,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    rVar7 = std::discrete_distribution<int>::operator()
                      ((discrete_distribution<int> *)&local_80,rng,&local_80);
    iVar12 = local_c8.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[rVar7].second;
    if (local_80._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pair<double,_int> *)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_50 != (void *)0x0) {
    operator_delete(local_50,local_40 - (long)local_50);
  }
  return iVar12;
}

Assistant:

gpt_vocab::id gpt_sample_top_k_top_p_repeat(
        const gpt_vocab & vocab,
        const float * logits,
        const int32_t * last_n_tokens_data,
        size_t last_n_tokens_data_size,
        int    top_k,
        double top_p,
        double temp,
        int repeat_last_n,
        float repeat_penalty,
        std::mt19937 & rng) {

    int n_logits = vocab.id_to_token.size();

    const auto * plogits = logits;

    const auto last_n_tokens = std::vector<int32_t>(last_n_tokens_data, last_n_tokens_data + last_n_tokens_data_size);

    if (temp <= 0) {
        // select the token with the highest logit directly
        float max_logit = plogits[0];
        gpt_vocab::id max_id = 0;

        for (int i = 1; i < n_logits; ++i) {
            if (plogits[i] > max_logit) {
                max_logit = plogits[i];
                max_id = i;
            }
        }
        return max_id;
    }


    std::vector<std::pair<double, gpt_vocab::id>> logits_id;
    logits_id.reserve(n_logits);

    {
        const float scale = 1.0f/temp;
        for (int i = 0; i < n_logits; ++i) {
            // repetition penalty from ctrl paper (https://arxiv.org/abs/1909.05858)
            // credit https://github.com/facebookresearch/llama/compare/main...shawwn:llama:main
            if (repeat_last_n > 0 && std::find(last_n_tokens.end()-repeat_last_n, last_n_tokens.end(), i) != last_n_tokens.end()) {
                // if score < 0 then repetition penalty has to multiplied to reduce the previous token probability
                if (plogits[i] < 0.0f) {
                    logits_id.push_back(std::make_pair(plogits[i]*scale*repeat_penalty, i));
                } else {
                    logits_id.push_back(std::make_pair(plogits[i]*scale/repeat_penalty, i));
                }
            } else {
                logits_id.push_back(std::make_pair(plogits[i]*scale, i));
            }
        }
    }

    // find the top K tokens
    std::partial_sort(
            logits_id.begin(),
            logits_id.begin() + top_k, logits_id.end(),
            [](const std::pair<double, gpt_vocab::id> & a, const std::pair<double, gpt_vocab::id> & b) {
        return a.first > b.first;
    });

    logits_id.resize(top_k);

    double maxl = -INFINITY;
    for (const auto & kv : logits_id) {
        maxl = std::max(maxl, kv.first);
    }

    // compute probs for the top K tokens
    std::vector<double> probs;
    probs.reserve(logits_id.size());

    double sum = 0.0;
    for (const auto & kv : logits_id) {
        double p = exp(kv.first - maxl);
        probs.push_back(p);
        sum += p;
    }

    // normalize the probs
    for (auto & p : probs) {
        p /= sum;
    }

    if (top_p < 1.0f) {
        double cumsum = 0.0f;
        for (int i = 0; i < top_k; i++) {
            cumsum += probs[i];
            if (cumsum >= top_p) {
                top_k = i + 1;
                probs.resize(top_k);
                logits_id.resize(top_k);
                break;
            }
        }

        cumsum = 1.0/cumsum;
        for (int i = 0; i < (int) probs.size(); i++) {
            probs[i] *= cumsum;
        }
    }

//    printf("\n");
//    for (int i = 0; i < (int) probs.size(); i++) {
//    for (int i = 0; i < 10; i++) {
//        printf("%d: '%s' %f\n", i, vocab.id_to_token.at(logits_id[i].second).c_str(), probs[i]);
//    }

    std::discrete_distribution<> dist(probs.begin(), probs.end());
    int idx = dist(rng);

    return logits_id[idx].second;

}